

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP4Base.cpp
# Opt level: O3

string * __thiscall
adios2::format::BP4Base::GetBPMetadataFileName
          (string *__return_storage_ptr__,BP4Base *this,string *name)

{
  size_type *psVar1;
  undefined8 uVar2;
  long *plVar3;
  undefined8 *puVar4;
  ulong *puVar5;
  ulong uVar6;
  string __str;
  string bpName;
  ulong *local_a0;
  long local_98;
  ulong local_90;
  long lStack_88;
  ulong *local_80;
  long local_78;
  ulong local_70 [2];
  undefined1 *local_60;
  ulong local_58;
  undefined1 local_50 [16];
  string local_40;
  
  helper::RemoveTrailingSlash(&local_40,name);
  local_60 = local_50;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_60,local_40._M_dataplus._M_p,
             local_40._M_dataplus._M_p + local_40._M_string_length);
  std::__cxx11::string::_M_replace_aux((ulong)&local_60,local_58,0,'\x01');
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_60);
  puVar5 = (ulong *)(plVar3 + 2);
  if ((ulong *)*plVar3 == puVar5) {
    local_90 = *puVar5;
    lStack_88 = plVar3[3];
    local_a0 = &local_90;
  }
  else {
    local_90 = *puVar5;
    local_a0 = (ulong *)*plVar3;
  }
  local_98 = plVar3[1];
  *plVar3 = (long)puVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  local_80 = local_70;
  std::__cxx11::string::_M_construct((ulong)&local_80,'\x01');
  *(undefined1 *)local_80 = 0x30;
  uVar6 = 0xf;
  if (local_a0 != &local_90) {
    uVar6 = local_90;
  }
  if (uVar6 < (ulong)(local_78 + local_98)) {
    uVar6 = 0xf;
    if (local_80 != local_70) {
      uVar6 = local_70[0];
    }
    if ((ulong)(local_78 + local_98) <= uVar6) {
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_80,0,(char *)0x0,(ulong)local_a0);
      goto LAB_0056e915;
    }
  }
  puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_a0,(ulong)local_80);
LAB_0056e915:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar1 = puVar4 + 2;
  if ((size_type *)*puVar4 == psVar1) {
    uVar2 = puVar4[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar2;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar4;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
  }
  __return_storage_ptr__->_M_string_length = puVar4[1];
  *puVar4 = psVar1;
  puVar4[1] = 0;
  *(undefined1 *)psVar1 = 0;
  if (local_80 != local_70) {
    operator_delete(local_80);
  }
  if (local_a0 != &local_90) {
    operator_delete(local_a0);
  }
  if (local_60 != local_50) {
    operator_delete(local_60);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string BP4Base::GetBPMetadataFileName(const std::string &name) const noexcept
{
    const std::string bpName = helper::RemoveTrailingSlash(name);
    const size_t index = 0; // global metadata file is generated by rank 0
    /* the name of the metadata file is "md.0" */
    const std::string bpMetaDataRankName(bpName + PathSeparator + "md." + std::to_string(index));
    return bpMetaDataRankName;
}